

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **arg)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ParameterObj par;
  bool bVar4;
  bool bVar5;
  ModelInstance *pMVar6;
  reference ppMVar7;
  vector<float,_std::allocator<float>_> *pvVar8;
  reference ppvVar9;
  reference pvVar10;
  reference pvVar11;
  reference pvVar12;
  reference pvVar13;
  reference pvVar14;
  reference pfVar15;
  reference pvVar16;
  reference pvVar17;
  reference ppMVar18;
  reference pvVar19;
  reference this;
  reference pvVar20;
  ostream *poVar21;
  long lVar22;
  undefined8 *puVar23;
  undefined8 *puVar24;
  byte bVar25;
  bool local_78ba;
  bool local_78b9;
  string local_7858 [32];
  vector<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_> local_7838;
  allocator local_7819;
  string local_7818 [8];
  string states_file;
  string local_77f8 [39];
  allocator local_77d1;
  string local_77d0 [8];
  string singleState_file;
  string local_77b0 [32];
  vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> local_7790;
  allocator local_7771;
  string local_7770 [8];
  string homotetramermoment_file;
  string local_7750 [32];
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> local_7730;
  allocator local_7711;
  string local_7710 [8];
  string homotetramer_file;
  string local_76f0 [32];
  vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> local_76d0;
  allocator local_76b1;
  string local_76b0 [8];
  string activemoment_file;
  string local_7690 [32];
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> local_7670;
  allocator local_7651;
  string local_7650 [8];
  string dimerbinding_file;
  string local_7630 [32];
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> local_7610;
  allocator local_75f1;
  string local_75f0 [8];
  string nicking_file;
  string local_75d0 [32];
  vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> local_75b0;
  allocator local_7591;
  string local_7590 [8];
  string nickingmoment_file;
  string local_7570 [8];
  ofstream out;
  int local_736c;
  int i_6;
  ModelInstance *model_3;
  iterator __end1_4;
  iterator __begin1_4;
  vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *__range1_4;
  int currentstate;
  int index_statesvector;
  int iStack_7334;
  int aiStack_7330 [36];
  undefined1 local_72a0 [8];
  vector<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_> states_arr;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_7280;
  int local_7274;
  iterator iStack_7270;
  int i_5;
  iterator it1_1;
  ModelInstance *model_2;
  iterator __end1_3;
  iterator __begin1_3;
  vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *__range1_3;
  value_type local_7240;
  undefined1 local_7238 [8];
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> homotetramer_arr;
  bool ishomotetramer;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_7210;
  float *local_7208;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_7200;
  int local_71f4;
  iterator iStack_71f0;
  int i_4;
  iterator it2;
  iterator it1;
  ModelInstance *model_1;
  iterator __end1_2;
  iterator __begin1_2;
  vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *__range1_2;
  value_type local_71b8;
  undefined1 local_71a0 [8];
  vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> boundarr;
  bool second_bound;
  bool first_bound;
  int i_3;
  ModelInstance *model;
  iterator __end1_1;
  iterator __begin1_1;
  vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *__range1_1;
  undefined1 auStack_7158 [5];
  bool nicked2;
  bool nicked1;
  float afStack_7150 [4];
  undefined1 local_7140 [8];
  vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> nicking_arr;
  ulong uStack_7120;
  int numtimesteps;
  size_t i_2;
  vector<float,_std::allocator<float>_> *pvStack_7110;
  int i_1;
  vector<float,_std::allocator<float>_> *myarr_ptr;
  value_type *it;
  iterator __end1;
  iterator __begin1;
  array<std::vector<float,_std::allocator<float>_>_*,_1000UL> *__range1;
  array<std::vector<float,_std::allocator<float>_>_*,_1000UL> arr_per_sim;
  UniformDistribution unif;
  float dt_plot;
  float dt_diffusion;
  float dt_reaction;
  float totaltime;
  undefined8 local_2a48 [670];
  ModelInstance *local_1558;
  int local_154c;
  undefined1 local_1548 [4];
  int i;
  vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> sims;
  int num_sims;
  undefined1 local_1514 [8];
  NetworkArray network;
  ParameterObj myparameters;
  IO myIO;
  char **arg_local;
  int argc_local;
  
  bVar25 = 0;
  unique0x10001fa1 = arg;
  IO::read((IO *)&network.nickingsite2,(int)&myparameters + 0xf,(void *)(ulong)(uint)argc,
           (size_t)arg);
  par.H_conc = myparameters.S_conc;
  par.top = (Topology)myparameters.L_conc;
  par.S_conc = (float)network.nickingsite2;
  par.L_conc = network.dt_react;
  par.subs = (Substrate)myparameters.H_conc;
  NetworkArray::NetworkArray((NetworkArray *)local_1514,par);
  sims.super__Vector_base<ModelInstance_*,_std::allocator<ModelInstance_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1000;
  std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::vector
            ((vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *)local_1548);
  for (local_154c = 0; local_154c < 1000; local_154c = local_154c + 1) {
    pMVar6 = (ModelInstance *)operator_new(0x1578);
    memcpy(local_2a48,local_1514,0x14e4);
    puVar23 = local_2a48;
    puVar24 = (undefined8 *)&stack0xffffffffffff6fa8;
    for (lVar22 = 0x29c; lVar22 != 0; lVar22 = lVar22 + -1) {
      *puVar24 = *puVar23;
      puVar23 = puVar23 + (ulong)bVar25 * -2 + 1;
      puVar24 = puVar24 + (ulong)bVar25 * -2 + 1;
    }
    ModelInstance::ModelInstance(pMVar6);
    local_1558 = pMVar6;
    std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::push_back
              ((vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *)local_1548,&local_1558);
  }
  ppMVar7 = std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::at
                      ((vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *)local_1548,0);
  fVar1 = (*ppMVar7)->totaltime;
  ppMVar7 = std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::at
                      ((vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *)local_1548,0);
  fVar2 = (*ppMVar7)->dt_react;
  ppMVar7 = std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::at
                      ((vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *)local_1548,0);
  fVar3 = (*ppMVar7)->dt_diff;
  UniformDistribution::UniformDistribution
            ((UniformDistribution *)(arr_per_sim._M_elems + 999),0.0,1.0);
  memset(&__range1,0,8000);
  __begin1 = (iterator)&__range1;
  __end1 = std::array<std::vector<float,_std::allocator<float>_>_*,_1000UL>::begin
                     ((array<std::vector<float,_std::allocator<float>_>_*,_1000UL> *)__begin1);
  it = std::array<std::vector<float,_std::allocator<float>_>_*,_1000UL>::end
                 ((array<std::vector<float,_std::allocator<float>_>_*,_1000UL> *)__begin1);
  for (; __end1 != it; __end1 = __end1 + 1) {
    myarr_ptr = (vector<float,_std::allocator<float>_> *)__end1;
    pvVar8 = (vector<float,_std::allocator<float>_> *)operator_new(0x18);
    std::vector<float,_std::allocator<float>_>::vector(pvVar8);
    pvStack_7110 = pvVar8;
    for (i_2._4_4_ = 0; pvVar8 = pvStack_7110,
        (float)i_2._4_4_ < (fVar1 + 30.0) * (1.0 / fVar2 + 2.0 / fVar3); i_2._4_4_ = i_2._4_4_ + 1)
    {
      i_2._0_4_ = UniformDistribution::getRandomNumber
                            ((UniformDistribution *)(arr_per_sim._M_elems + 999));
      std::vector<float,_std::allocator<float>_>::push_back(pvVar8,(value_type_conflict *)&i_2);
    }
    (myarr_ptr->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
    _M_start = (pointer)pvStack_7110;
  }
  for (uStack_7120 = 0; uStack_7120 < 1000; uStack_7120 = uStack_7120 + 1) {
    ppMVar7 = std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::at
                        ((vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *)local_1548,
                         uStack_7120);
    pMVar6 = *ppMVar7;
    ppvVar9 = std::array<std::vector<float,_std::allocator<float>_>_*,_1000UL>::at
                        ((array<std::vector<float,_std::allocator<float>_>_*,_1000UL> *)&__range1,
                         uStack_7120);
    ModelInstance::main(pMVar6,*ppvVar9);
  }
  nicking_arr.super__Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 3000;
  auStack_7158._0_4_ = 0.0;
  stack0xffffffffffff8eac = 0.0;
  afStack_7150[0] = 0.0;
  afStack_7150[1] = 0.0;
  std::allocator<std::array<float,_4UL>_>::allocator
            ((allocator<std::array<float,_4UL>_> *)((long)&__range1_1 + 7));
  std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::vector
            ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)local_7140,
             3000,(value_type *)auStack_7158,
             (allocator<std::array<float,_4UL>_> *)((long)&__range1_1 + 7));
  std::allocator<std::array<float,_4UL>_>::~allocator
            ((allocator<std::array<float,_4UL>_> *)((long)&__range1_1 + 7));
  __end1_1 = std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::begin
                       ((vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *)local_1548);
  model = (ModelInstance *)
          std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::end
                    ((vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *)local_1548);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<ModelInstance_**,_std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>_>
                             *)&model), bVar4) {
    ppMVar18 = __gnu_cxx::
               __normal_iterator<ModelInstance_**,_std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>_>
               ::operator*(&__end1_1);
    pMVar6 = *ppMVar18;
    for (boundarr.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        boundarr.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ < 3000;
        boundarr.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             boundarr.
             super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      local_78b9 = false;
      if (0.0 < pMVar6->nick1) {
        local_78b9 = pMVar6->nick1 <
                     (float)boundarr.
                            super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * 0.1;
      }
      __range1_1._6_1_ = local_78b9;
      local_78ba = false;
      if (0.0 < pMVar6->nick2) {
        local_78ba = pMVar6->nick2 <
                     (float)boundarr.
                            super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ * 0.1;
      }
      __range1_1._5_1_ = local_78ba;
      if ((local_78b9 == false) && (local_78ba == false)) {
        pvVar10 = std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::at
                            ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                              *)local_7140,
                             (long)boundarr.
                                   super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        pvVar11 = std::array<float,_4UL>::at(pvVar10,0);
        *pvVar11 = *pvVar11 + 0.001;
      }
      if (((__range1_1._6_1_ & 1) != 0) && ((__range1_1._5_1_ & 1) == 0)) {
        pvVar10 = std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::at
                            ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                              *)local_7140,
                             (long)boundarr.
                                   super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        pvVar11 = std::array<float,_4UL>::at(pvVar10,1);
        *pvVar11 = *pvVar11 + 0.001;
      }
      if (((__range1_1._6_1_ & 1) == 0) && ((__range1_1._5_1_ & 1) != 0)) {
        pvVar10 = std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::at
                            ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                              *)local_7140,
                             (long)boundarr.
                                   super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        pvVar11 = std::array<float,_4UL>::at(pvVar10,2);
        *pvVar11 = *pvVar11 + 0.001;
      }
      if (((__range1_1._6_1_ & 1) != 0) && ((__range1_1._5_1_ & 1) != 0)) {
        pvVar10 = std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::at
                            ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                              *)local_7140,
                             (long)boundarr.
                                   super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        pvVar11 = std::array<float,_4UL>::at(pvVar10,3);
        *pvVar11 = *pvVar11 + 0.001;
      }
    }
    __gnu_cxx::
    __normal_iterator<ModelInstance_**,_std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>_>
    ::operator++(&__end1_1);
  }
  local_71b8._M_elems[0] = 0;
  local_71b8._M_elems[1] = 0;
  local_71b8._M_elems[2] = 0;
  local_71b8._M_elems[3] = 0;
  std::allocator<std::array<int,_4UL>_>::allocator
            ((allocator<std::array<int,_4UL>_> *)((long)&__range1_2 + 7));
  std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::vector
            ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)local_71a0,3000
             ,&local_71b8,(allocator<std::array<int,_4UL>_> *)((long)&__range1_2 + 7));
  std::allocator<std::array<int,_4UL>_>::~allocator
            ((allocator<std::array<int,_4UL>_> *)((long)&__range1_2 + 7));
  __end1_2 = std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::begin
                       ((vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *)local_1548);
  model_1 = (ModelInstance *)
            std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::end
                      ((vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *)local_1548);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<ModelInstance_**,_std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>_>
                             *)&model_1), bVar4) {
    ppMVar18 = __gnu_cxx::
               __normal_iterator<ModelInstance_**,_std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>_>
               ::operator*(&__end1_2);
    pMVar6 = *ppMVar18;
    boundarr.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
    boundarr.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
    pvVar12 = std::array<std::vector<float,_std::allocator<float>_>,_2UL>::at
                        (&pMVar6->dimersactive,0);
    it2 = std::vector<float,_std::allocator<float>_>::begin(pvVar12);
    pvVar12 = std::array<std::vector<float,_std::allocator<float>_>,_2UL>::at
                        (&pMVar6->dimersactive,1);
    iStack_71f0 = std::vector<float,_std::allocator<float>_>::begin(pvVar12);
    for (local_71f4 = 0; local_71f4 < 3000; local_71f4 = local_71f4 + 1) {
      pvVar12 = std::array<std::vector<float,_std::allocator<float>_>,_2UL>::at
                          (&pMVar6->dimersactive,0);
      local_7200._M_current = (float *)std::vector<float,_std::allocator<float>_>::end(pvVar12);
      bVar5 = __gnu_cxx::operator!=(&it2,&local_7200);
      bVar4 = false;
      if (bVar5) {
        pfVar15 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                  ::operator*(&it2);
        bVar4 = *pfVar15 <= (float)local_71f4 * 0.1;
      }
      if (bVar4) {
        boundarr.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ =
             (boundarr.
              super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ ^ 0xff) & 1;
        local_7208 = (float *)__gnu_cxx::
                              __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                              ::operator++(&it2,0);
      }
      else if (((boundarr.
                 super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) &&
              (pMVar6->currenttime < (float)local_71f4 * 0.1)) {
        boundarr.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
      }
      pvVar12 = std::array<std::vector<float,_std::allocator<float>_>,_2UL>::at
                          (&pMVar6->dimersactive,1);
      local_7210._M_current = (float *)std::vector<float,_std::allocator<float>_>::end(pvVar12);
      bVar5 = __gnu_cxx::operator!=(&stack0xffffffffffff8e10,&local_7210);
      bVar4 = false;
      if (bVar5) {
        pfVar15 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                  ::operator*(&stack0xffffffffffff8e10);
        bVar4 = *pfVar15 <= (float)local_71f4 * 0.1;
      }
      if (bVar4) {
        boundarr.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ =
             (boundarr.
              super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ ^ 0xff) & 1;
        __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
        operator++(&stack0xffffffffffff8e10,0);
      }
      else if (((boundarr.
                 super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ & 1) != 0) &&
              (pMVar6->currenttime < (float)local_71f4 * 0.1)) {
        boundarr.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
      }
      if (((boundarr.
            super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) &&
         ((boundarr.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ & 1) == 0)) {
        pvVar13 = std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::at
                            ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *
                             )local_71a0,(long)local_71f4);
        pvVar14 = std::array<int,_4UL>::at(pvVar13,0);
        *pvVar14 = *pvVar14 + 1;
      }
      if (((boundarr.
            super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) &&
         ((boundarr.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ & 1) == 0)) {
        pvVar13 = std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::at
                            ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *
                             )local_71a0,(long)local_71f4);
        pvVar14 = std::array<int,_4UL>::at(pvVar13,1);
        *pvVar14 = *pvVar14 + 1;
      }
      if (((boundarr.
            super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) &&
         ((boundarr.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ & 1) != 0)) {
        pvVar13 = std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::at
                            ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *
                             )local_71a0,(long)local_71f4);
        pvVar14 = std::array<int,_4UL>::at(pvVar13,2);
        *pvVar14 = *pvVar14 + 1;
      }
      if (((boundarr.
            super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage._3_1_ & 1) != 0) &&
         ((boundarr.super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ & 1) != 0)) {
        pvVar13 = std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::at
                            ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *
                             )local_71a0,(long)local_71f4);
        pvVar14 = std::array<int,_4UL>::at(pvVar13,3);
        *pvVar14 = *pvVar14 + 1;
      }
    }
    __gnu_cxx::
    __normal_iterator<ModelInstance_**,_std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>_>
    ::operator++(&__end1_2);
  }
  local_7240._M_elems[0] = 0.0;
  local_7240._M_elems[1] = 0.0;
  std::allocator<std::array<float,_2UL>_>::allocator
            ((allocator<std::array<float,_2UL>_> *)((long)&__range1_3 + 7));
  std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::vector
            ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)local_7238,
             3000,&local_7240,(allocator<std::array<float,_2UL>_> *)((long)&__range1_3 + 7));
  std::allocator<std::array<float,_2UL>_>::~allocator
            ((allocator<std::array<float,_2UL>_> *)((long)&__range1_3 + 7));
  __end1_3 = std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::begin
                       ((vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *)local_1548);
  model_2 = (ModelInstance *)
            std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::end
                      ((vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *)local_1548);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_3,
                            (__normal_iterator<ModelInstance_**,_std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>_>
                             *)&model_2), bVar4) {
    ppMVar18 = __gnu_cxx::
               __normal_iterator<ModelInstance_**,_std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>_>
               ::operator*(&__end1_3);
    it1_1._M_current = (float *)*ppMVar18;
    homotetramer_arr.
    super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
    iStack_7270 = std::vector<float,_std::allocator<float>_>::begin
                            (&((ModelInstance *)it1_1._M_current)->homotetramer);
    for (local_7274 = 0; local_7274 < 3000; local_7274 = local_7274 + 1) {
      local_7280._M_current =
           (float *)std::vector<float,_std::allocator<float>_>::end
                              ((vector<float,_std::allocator<float>_> *)(it1_1._M_current + 0x552));
      bVar5 = __gnu_cxx::operator!=(&stack0xffffffffffff8d90,&local_7280);
      bVar4 = false;
      if (bVar5) {
        pfVar15 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>
                  ::operator*(&stack0xffffffffffff8d90);
        bVar4 = *pfVar15 <= (float)local_7274 * 0.1;
      }
      if (bVar4) {
        homotetramer_arr.
        super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage._7_1_ =
             (homotetramer_arr.
              super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ ^ 0xff) & 1;
        states_arr.
        super__Vector_base<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)__gnu_cxx::
                      __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
                      operator++(&stack0xffffffffffff8d90,0);
      }
      if ((homotetramer_arr.
           super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
        if ((float)local_7274 * 0.1 <= it1_1._M_current[0x544]) {
          pvVar16 = std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
                    at((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                       local_7238,(long)local_7274);
          pvVar17 = std::array<float,_2UL>::at(pvVar16,1);
          *pvVar17 = *pvVar17 + 1.0;
        }
      }
      else {
        pvVar16 = std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::at
                            ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                              *)local_7238,(long)local_7274);
        pvVar17 = std::array<float,_2UL>::at(pvVar16,0);
        *pvVar17 = *pvVar17 + 1.0;
      }
    }
    __gnu_cxx::
    __normal_iterator<ModelInstance_**,_std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>_>
    ::operator++(&__end1_3);
  }
  aiStack_7330[0x1e] = 0;
  aiStack_7330[0x1f] = 0;
  aiStack_7330[0x20] = 0;
  aiStack_7330[0x21] = 0;
  aiStack_7330[0x1a] = 0;
  aiStack_7330[0x1b] = 0;
  aiStack_7330[0x1c] = 0;
  aiStack_7330[0x1d] = 0;
  aiStack_7330[0x16] = 0;
  aiStack_7330[0x17] = 0;
  aiStack_7330[0x18] = 0;
  aiStack_7330[0x19] = 0;
  aiStack_7330[0x12] = 0;
  aiStack_7330[0x13] = 0;
  aiStack_7330[0x14] = 0;
  aiStack_7330[0x15] = 0;
  aiStack_7330[0xe] = 0;
  aiStack_7330[0xf] = 0;
  aiStack_7330[0x10] = 0;
  aiStack_7330[0x11] = 0;
  aiStack_7330[10] = 0;
  aiStack_7330[0xb] = 0;
  aiStack_7330[0xc] = 0;
  aiStack_7330[0xd] = 0;
  aiStack_7330[6] = 0;
  aiStack_7330[7] = 0;
  aiStack_7330[8] = 0;
  aiStack_7330[9] = 0;
  aiStack_7330[2] = 0;
  aiStack_7330[3] = 0;
  aiStack_7330[4] = 0;
  aiStack_7330[5] = 0;
  index_statesvector = 0;
  iStack_7334 = 0;
  aiStack_7330[0] = 0;
  aiStack_7330[1] = 0;
  std::allocator<std::array<int,_36UL>_>::allocator
            ((allocator<std::array<int,_36UL>_> *)((long)&currentstate + 3));
  std::vector<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>::vector
            ((vector<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_> *)local_72a0,
             3000,(value_type *)&index_statesvector,
             (allocator<std::array<int,_36UL>_> *)((long)&currentstate + 3));
  std::allocator<std::array<int,_36UL>_>::~allocator
            ((allocator<std::array<int,_36UL>_> *)((long)&currentstate + 3));
  __end1_4 = std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::begin
                       ((vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *)local_1548);
  model_3 = (ModelInstance *)
            std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::end
                      ((vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *)local_1548);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_4,
                            (__normal_iterator<ModelInstance_**,_std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>_>
                             *)&model_3), bVar4) {
    ppMVar18 = __gnu_cxx::
               __normal_iterator<ModelInstance_**,_std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>_>
               ::operator*(&__end1_4);
    pMVar6 = *ppMVar18;
    __range1_4._4_4_ = 1;
    for (local_736c = 0; local_736c < 3000; local_736c = local_736c + 1) {
      if (0 < __range1_4._4_4_) {
        pvVar19 = std::vector<int,_std::allocator<int>_>::at
                            (&pMVar6->states,(long)(int)(((float)local_736c * 0.1) / fVar2));
        __range1_4._4_4_ = *pvVar19;
      }
      this = std::vector<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>::at
                       ((vector<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_> *)
                        local_72a0,(long)local_736c);
      pvVar20 = std::array<int,_36UL>::at(this,(long)__range1_4._4_4_);
      *pvVar20 = *pvVar20 + 1;
    }
    __gnu_cxx::
    __normal_iterator<ModelInstance_**,_std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>_>
    ::operator++(&__end1_4);
  }
  std::ofstream::ofstream(local_7570);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7590,"nicking_moments.tsv",&local_7591);
  std::allocator<char>::~allocator((allocator<char> *)&local_7591);
  std::ofstream::open(local_7570,(_Ios_Openmode)local_7590);
  poVar21 = (ostream *)std::ostream::operator<<((ostream *)local_7570,fVar1);
  poVar21 = std::operator<<(poVar21,"\t");
  poVar21 = (ostream *)std::ostream::operator<<(poVar21,0.1);
  poVar21 = std::operator<<(poVar21,"\t");
  poVar21 = (ostream *)std::ostream::operator<<(poVar21,1000);
  std::ostream::operator<<(poVar21,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::vector
            (&local_75b0,(vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *)local_1548);
  std::__cxx11::string::string(local_75d0,local_7590);
  IO::momentsNicking((IO *)((long)&myparameters.top + 3),&local_75b0,(string *)local_75d0);
  std::__cxx11::string::~string(local_75d0);
  std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::~vector(&local_75b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_75f0,"nicking.tsv",&local_75f1);
  std::allocator<char>::~allocator((allocator<char> *)&local_75f1);
  std::ofstream::open(local_7570,(_Ios_Openmode)local_75f0);
  poVar21 = (ostream *)std::ostream::operator<<((ostream *)local_7570,fVar1);
  poVar21 = std::operator<<(poVar21,"\t");
  poVar21 = (ostream *)std::ostream::operator<<(poVar21,0.1);
  poVar21 = std::operator<<(poVar21,"\t");
  poVar21 = (ostream *)std::ostream::operator<<(poVar21,1000);
  std::ostream::operator<<(poVar21,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::vector
            (&local_7610,
             (vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)local_7140)
  ;
  std::__cxx11::string::string(local_7630,local_75f0);
  IO::writeNicking((IO *)((long)&myparameters.top + 3),&local_7610,(string *)local_7630);
  std::__cxx11::string::~string(local_7630);
  std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::~vector
            (&local_7610);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7650,"dimerBinding.tsv",&local_7651);
  std::allocator<char>::~allocator((allocator<char> *)&local_7651);
  std::ofstream::open(local_7570,(_Ios_Openmode)local_7650);
  poVar21 = (ostream *)std::ostream::operator<<((ostream *)local_7570,fVar1);
  poVar21 = std::operator<<(poVar21,"\t");
  poVar21 = (ostream *)std::ostream::operator<<(poVar21,0.1);
  poVar21 = std::operator<<(poVar21,"\t");
  poVar21 = (ostream *)std::ostream::operator<<(poVar21,1000);
  std::ostream::operator<<(poVar21,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::vector
            (&local_7670,
             (vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)local_71a0);
  std::__cxx11::string::string(local_7690,local_7650);
  IO::writeDimerActivating((IO *)((long)&myparameters.top + 3),&local_7670,(string *)local_7690);
  std::__cxx11::string::~string(local_7690);
  std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::~vector(&local_7670);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_76b0,"dimerBinding_moments.tsv",&local_76b1);
  std::allocator<char>::~allocator((allocator<char> *)&local_76b1);
  std::ofstream::open(local_7570,(_Ios_Openmode)local_76b0);
  poVar21 = (ostream *)std::ostream::operator<<((ostream *)local_7570,fVar1);
  poVar21 = std::operator<<(poVar21,"\t");
  poVar21 = (ostream *)std::ostream::operator<<(poVar21,0.1);
  poVar21 = std::operator<<(poVar21,"\t");
  poVar21 = (ostream *)std::ostream::operator<<(poVar21,1000);
  std::ostream::operator<<(poVar21,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::vector
            (&local_76d0,(vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *)local_1548);
  std::__cxx11::string::string(local_76f0,local_76b0);
  IO::momentsActive((IO *)((long)&myparameters.top + 3),&local_76d0,(string *)local_76f0);
  std::__cxx11::string::~string(local_76f0);
  std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::~vector(&local_76d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7710,"homotetramers.tsv",&local_7711);
  std::allocator<char>::~allocator((allocator<char> *)&local_7711);
  std::ofstream::open(local_7570,(_Ios_Openmode)local_7710);
  poVar21 = (ostream *)std::ostream::operator<<((ostream *)local_7570,fVar1);
  poVar21 = std::operator<<(poVar21,"\t");
  poVar21 = (ostream *)std::ostream::operator<<(poVar21,0.1);
  poVar21 = std::operator<<(poVar21,"\t");
  poVar21 = (ostream *)std::ostream::operator<<(poVar21,1000);
  std::ostream::operator<<(poVar21,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::vector
            (&local_7730,
             (vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)local_7238)
  ;
  std::__cxx11::string::string(local_7750,local_7710);
  IO::writeHomotetramers((IO *)((long)&myparameters.top + 3),&local_7730,(string *)local_7750);
  std::__cxx11::string::~string(local_7750);
  std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::~vector
            (&local_7730);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7770,"homotetramers_moments.tsv",&local_7771);
  std::allocator<char>::~allocator((allocator<char> *)&local_7771);
  std::ofstream::open(local_7570,(_Ios_Openmode)local_7770);
  poVar21 = (ostream *)std::ostream::operator<<((ostream *)local_7570,fVar1);
  poVar21 = std::operator<<(poVar21,"\t");
  poVar21 = (ostream *)std::ostream::operator<<(poVar21,0.1);
  poVar21 = std::operator<<(poVar21,"\t");
  poVar21 = (ostream *)std::ostream::operator<<(poVar21,1000);
  std::ostream::operator<<(poVar21,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::vector
            (&local_7790,(vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *)local_1548);
  std::__cxx11::string::string(local_77b0,local_7770);
  IO::momentsHomotetramer((IO *)((long)&myparameters.top + 3),&local_7790,(string *)local_77b0);
  std::__cxx11::string::~string(local_77b0);
  std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::~vector(&local_7790);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_77d0,"statesSingle.tsv",&local_77d1);
  std::allocator<char>::~allocator((allocator<char> *)&local_77d1);
  std::ofstream::open(local_7570,(_Ios_Openmode)local_77d0);
  std::ofstream::close();
  ppMVar7 = std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::at
                      ((vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *)local_1548,0);
  pMVar6 = *ppMVar7;
  std::__cxx11::string::string(local_77f8,local_77d0);
  IO::singleStates((IO *)((long)&myparameters.top + 3),pMVar6,(string *)local_77f8);
  std::__cxx11::string::~string(local_77f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7818,"states.tsv",&local_7819);
  std::allocator<char>::~allocator((allocator<char> *)&local_7819);
  std::ofstream::open(local_7570,(_Ios_Openmode)local_7818);
  poVar21 = (ostream *)std::ostream::operator<<((ostream *)local_7570,fVar1);
  poVar21 = std::operator<<(poVar21,"\t");
  poVar21 = (ostream *)std::ostream::operator<<(poVar21,0.1);
  poVar21 = std::operator<<(poVar21,"\t");
  poVar21 = (ostream *)std::ostream::operator<<(poVar21,1000);
  std::ostream::operator<<(poVar21,std::endl<char,std::char_traits<char>>);
  std::ofstream::close();
  std::vector<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>::vector
            (&local_7838,
             (vector<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_> *)local_72a0);
  std::__cxx11::string::string(local_7858,local_7818);
  IO::writeStates((IO *)((long)&myparameters.top + 3),&local_7838,(string *)local_7858);
  std::__cxx11::string::~string(local_7858);
  std::vector<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>::~vector(&local_7838);
  poVar21 = std::operator<<((ostream *)&std::cout,"finished");
  std::ostream::operator<<(poVar21,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_7818);
  std::__cxx11::string::~string(local_77d0);
  std::__cxx11::string::~string(local_7770);
  std::__cxx11::string::~string(local_7710);
  std::__cxx11::string::~string(local_76b0);
  std::__cxx11::string::~string(local_7650);
  std::__cxx11::string::~string(local_75f0);
  std::__cxx11::string::~string(local_7590);
  std::ofstream::~ofstream(local_7570);
  std::vector<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_>::~vector
            ((vector<std::array<int,_36UL>,_std::allocator<std::array<int,_36UL>_>_> *)local_72a0);
  std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::~vector
            ((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)local_7238)
  ;
  std::vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>::~vector
            ((vector<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_> *)local_71a0);
  std::vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::~vector
            ((vector<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_> *)local_7140)
  ;
  UniformDistribution::~UniformDistribution((UniformDistribution *)(arr_per_sim._M_elems + 999));
  std::vector<ModelInstance_*,_std::allocator<ModelInstance_*>_>::~vector
            ((vector<ModelInstance_*,_std::allocator<ModelInstance_*>_> *)local_1548);
  return 0;
}

Assistant:

int main(int argc, char ** arg) {
	IO myIO;
	ParameterObj myparameters = myIO.read(argc, arg);

	NetworkArray network(myparameters);		// Set up the network
	const int num_sims = 1000;

	std::vector<ModelInstance*> sims; // create vector of pointers to model objects
	for (int i=0; i<num_sims; i++){
		sims.push_back(new ModelInstance(network, myparameters));
	}

	float totaltime = sims.at(0)->totaltime;
	float dt_reaction = sims.at(0)->dt_react;
	float dt_diffusion = sims.at(0)->dt_diff;
	float dt_plot = 0.1;

	UniformDistribution unif(0,1);
	std::array<std::vector<float>*, num_sims> arr_per_sim{};
	for (auto & it : arr_per_sim) {
		auto *myarr_ptr = new std::vector<float>;
		for (int i = 0; i < (totaltime+30.0)*(1/dt_reaction + 2/dt_diffusion); i++) {
			myarr_ptr->push_back(unif.getRandomNumber());
		}
		it = myarr_ptr;
	}

#pragma omp parallel
	{
#pragma omp for
		for (size_t i = 0; i < num_sims; i++){
			sims.at(i)->main(arr_per_sim.at(i));
		}
	}

	const int numtimesteps = 3000;
	std::vector<std::array<float, 4>> nicking_arr(numtimesteps, std::array<float, 4>{});
	bool nicked1;
	bool nicked2;

	// Create table nicking fractions over time
	for (ModelInstance* model: sims){
		for (int i = 0; i< numtimesteps; i++) {
			nicked1 = model->nick1 >0 && model->nick1 < i*dt_plot;
			nicked2 = model->nick2 >0 && model->nick2 < i*dt_plot;
			if (!nicked1 && !nicked2){
				nicking_arr.at(i).at(0) += 1.0 / num_sims;
			}
			if (nicked1 && !nicked2){
				nicking_arr.at(i).at(1) += 1.0 / num_sims;
			}
			if (!nicked1 && nicked2){
				nicking_arr.at(i).at(2) += 1.0 / num_sims;
			}
			if (nicked1 && nicked2){
				nicking_arr.at(i).at(3) += 1.0 / num_sims;
			}
		}
	}

	// Create table activations over time
	bool first_bound;
	bool second_bound;
	std::vector<std::array<int, 4>> boundarr(numtimesteps, std::array<int, 4>{});
	for (ModelInstance* model: sims){
		first_bound = false;
		second_bound = false;
		auto it1 = model->dimersactive.at(0).begin();
		auto it2 = model->dimersactive.at(1).begin();
		for (int i = 0; i< numtimesteps; i++) {
			if (it1 != model->dimersactive.at(0).end() && *it1 <= i * dt_plot){
				first_bound = !first_bound;
				it1++;
			}
			else if(first_bound && model->currenttime < i * dt_plot){
				first_bound = false;
			}
			if (it2 != model->dimersactive.at(1).end() && *it2 <= i * dt_plot){
				second_bound = !second_bound;
				it2++;
			}
			else if(second_bound && model->currenttime < i * dt_plot){
				second_bound = false;
			}
			if (!first_bound && !second_bound){
				boundarr.at(i).at(0) += 1;
			}
			if (first_bound && !second_bound){
				boundarr.at(i).at(1) += 1;
			}
			if (!first_bound && second_bound){
				boundarr.at(i).at(2) += 1;
			}
			if (first_bound && second_bound){
				boundarr.at(i).at(3) += 1;
			}
		}
	}

	// Create table homo/heterodimers over time
	bool ishomotetramer;
	std::vector<std::array<float,2>> homotetramer_arr(numtimesteps, std::array<float, 2>{});
	for(ModelInstance * model: sims){
		ishomotetramer = false;
		auto it1 = model->homotetramer.begin();
		for (int i = 0; i< numtimesteps; i++) {
			if (it1 != model->homotetramer.end() && *it1 <= i * dt_plot){
				ishomotetramer = !ishomotetramer;
				it1++;
			}
			if(ishomotetramer){
				homotetramer_arr.at(i).at(0) += 1;
			}
			else if(model->currenttime >= i * dt_plot){
				homotetramer_arr.at(i).at(1) += 1;
			}
		}
	}

	// Create table states over tine
	std::vector<std::array<int, 36>> states_arr(numtimesteps, std::array<int, 36>{});
	int index_statesvector;
	int currentstate;
	for (ModelInstance * model: sims) {
		currentstate = 1;
		for (int i=0; i<numtimesteps; i++){
			index_statesvector = float(i)*dt_plot/dt_reaction;
			if (currentstate > 0) {
				currentstate = model->states.at(index_statesvector);
			}
			states_arr.at(i).at(currentstate) += 1;
		}
	}

	std::ofstream out;

	// Save nicking moments
	std::string nickingmoment_file = "nicking_moments.tsv";
	out.open(nickingmoment_file);
	out << totaltime << "\t" << dt_plot << "\t" << num_sims << std::endl;
	out.close();
	myIO.momentsNicking(sims, nickingmoment_file);

	// Save nicking fractions over time
	std::string nicking_file = "nicking.tsv";
	out.open(nicking_file);
	out << totaltime << "\t" << dt_plot << "\t" << num_sims << std::endl;
	out.close();
	myIO.writeNicking(nicking_arr, nicking_file);

	// Save active dimers over time
	std::string dimerbinding_file = "dimerBinding.tsv";
	out.open(dimerbinding_file);
	out << totaltime << "\t" << dt_plot << "\t" << num_sims << std::endl;
	out.close();
	myIO.writeDimerActivating(boundarr, dimerbinding_file);

	// Save binding/unbinding moments
	std::string activemoment_file = "dimerBinding_moments.tsv";
	out.open(activemoment_file);
	out << totaltime << "\t" << dt_plot << "\t" << num_sims << std::endl;
	out.close();
	myIO.momentsActive(sims, activemoment_file);

	// Save homo/heterotetramers over time
	std::string homotetramer_file = "homotetramers.tsv";
	out.open(homotetramer_file);
	out << totaltime << "\t" << dt_plot << "\t" << num_sims << std::endl;
	out.close();
	myIO.writeHomotetramers(homotetramer_arr, homotetramer_file);

	// Save homotetramer moments
	std::string homotetramermoment_file = "homotetramers_moments.tsv";
	out.open(homotetramermoment_file);
	out << totaltime << "\t" << dt_plot << "\t" << num_sims << std::endl;
	out.close();
	myIO.momentsHomotetramer(sims, homotetramermoment_file);

	std::string singleState_file = "statesSingle.tsv";
	out.open(singleState_file);
	out.close();
	myIO.singleStates(sims.at(0), singleState_file);

	std::string states_file = "states.tsv";
	out.open(states_file);
	out << totaltime << "\t" << dt_plot << "\t" << num_sims << std::endl;
	out.close();
	myIO.writeStates(states_arr, states_file);

	std::cout << "finished" << std::endl;
	return 0;
}